

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O1

void fib_gen(void *null)

{
  Value VVar1;
  _Bool _Var2;
  Value VVar3;
  Value VVar4;
  Value v;
  Value local_28;
  
  local_28.u64 = 0;
  gen_yield(&local_28);
  _Var2 = gen_should_finish();
  if (!_Var2) {
    VVar1.u64 = 1;
    VVar4.u64 = 0;
    do {
      VVar3 = VVar1;
      local_28 = VVar3;
      gen_yield(&local_28);
      _Var2 = gen_should_finish();
      VVar1.u64 = VVar4.u64 + VVar3.u64;
      VVar4 = VVar3;
    } while (!_Var2);
  }
  return;
}

Assistant:

static void
fib_gen(void *null)
{
    (void) null;
    uint64_t f0 = 0;
    uint64_t f1 = 1;
    Value v;
    v.u64 = f0;
    gen_yield(&v);
    while (!gen_should_finish()) {
        v.u64 = f1;
        gen_yield(&v);
        uint64_t tmp = f0;
        f0 = f1;
        f1 += tmp;
    }
}